

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZGeoNodeBC_*>::TPZVec(TPZVec<TPZGeoNodeBC_*> *this,int64_t size,TPZGeoNodeBC **copy)

{
  TPZGeoNodeBC *pTVar1;
  TPZGeoNodeBC **ppTVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01814130;
  this->fStore = (TPZGeoNodeBC **)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZVec<TPZGeoNodeBC *>::TPZVec(const int64_t, const T &) [T = TPZGeoNodeBC *]",0x4d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else if (size == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    lVar3 = 0;
    ppTVar2 = (TPZGeoNodeBC **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    this->fStore = ppTVar2;
    this->fNElements = size;
    this->fNAlloc = size;
    pTVar1 = *copy;
    do {
      this->fStore[lVar3] = pTVar1;
      lVar3 = lVar3 + 1;
    } while (size != lVar3);
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}